

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int gen_publickey_from_ed_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  int iVar1;
  uchar *local_78;
  uchar *bufPos;
  size_t bufLen;
  uchar *keyBuf;
  size_t rawKeyLen;
  uchar *methodBuf;
  char cStack_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char methodName [12];
  EVP_PKEY *pk_local;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  LIBSSH2_SESSION *session_local;
  
  methodBuf._4_1_ = 's';
  methodBuf._5_1_ = 's';
  methodBuf._6_1_ = 'h';
  methodBuf._7_1_ = '-';
  cStack_48 = 'e';
  cStack_47 = 'd';
  cStack_46 = '2';
  cStack_45 = '5';
  builtin_strncpy(methodName,"519",4);
  rawKeyLen = 0;
  keyBuf = (uchar *)0x0;
  bufLen = 0;
  bufPos = (uchar *)0x0;
  local_78 = (uchar *)0x0;
  methodName._4_8_ = pk;
  rawKeyLen = (size_t)(*session->alloc)(0xb,&session->abstract);
  if ((char *)rawKeyLen == (char *)0x0) {
    _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  }
  else {
    *(undefined8 *)rawKeyLen = stack0xffffffffffffffb4;
    *(undefined2 *)(rawKeyLen + 8) = methodName._0_2_;
    *(char *)(rawKeyLen + 10) = methodName[2];
    iVar1 = EVP_PKEY_get_raw_public_key(methodName._4_8_,0,&keyBuf);
    if (iVar1 == 1) {
      bufPos = keyBuf + 0x13;
      local_78 = (uchar *)(*session->alloc)((size_t)bufPos,&session->abstract);
      bufLen = (size_t)local_78;
      if (local_78 == (uchar *)0x0) {
        _libssh2_error(session,-6,"Unable to allocate memory for private key data");
      }
      else {
        _libssh2_store_str(&local_78,(char *)((long)&methodBuf + 4),0xb);
        _libssh2_store_u32(&local_78,(uint32_t)keyBuf);
        iVar1 = EVP_PKEY_get_raw_public_key(methodName._4_8_,local_78,&keyBuf);
        if (iVar1 == 1) {
          *method = (uchar *)rawKeyLen;
          if (method_len != (size_t *)0x0) {
            *method_len = 0xb;
          }
          *pubkeydata = (uchar *)bufLen;
          if (pubkeydata_len != (size_t *)0x0) {
            *pubkeydata_len = (size_t)bufPos;
          }
          return 0;
        }
        _libssh2_error(session,-0xe,"EVP_PKEY_get_raw_public_key failed");
      }
    }
    else {
      _libssh2_error(session,-0xe,"EVP_PKEY_get_raw_public_key failed");
    }
  }
  if (rawKeyLen != 0) {
    (*session->free)((void *)rawKeyLen,&session->abstract);
  }
  if (bufLen != 0) {
    (*session->free)((void *)bufLen,&session->abstract);
  }
  return -1;
}

Assistant:

static int
gen_publickey_from_ed_evp(LIBSSH2_SESSION *session,
                          unsigned char **method,
                          size_t *method_len,
                          unsigned char **pubkeydata,
                          size_t *pubkeydata_len,
                          EVP_PKEY *pk)
{
    const char methodName[] = "ssh-ed25519";
    unsigned char *methodBuf = NULL;
    size_t rawKeyLen = 0;
    unsigned char *keyBuf = NULL;
    size_t bufLen = 0;
    unsigned char *bufPos = NULL;

    _libssh2_debug((session, LIBSSH2_TRACE_AUTH,
                   "Computing public key from ED private key envelope"));

    methodBuf = LIBSSH2_ALLOC(session, sizeof(methodName) - 1);
    if(!methodBuf) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }
    memcpy(methodBuf, methodName, sizeof(methodName) - 1);

    if(EVP_PKEY_get_raw_public_key(pk, NULL, &rawKeyLen) != 1) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "EVP_PKEY_get_raw_public_key failed");
        goto fail;
    }

    /* Key form is: type_len(4) + type(11) + pub_key_len(4) + pub_key(32). */
    bufLen = 4 + sizeof(methodName) - 1  + 4 + rawKeyLen;
    bufPos = keyBuf = LIBSSH2_ALLOC(session, bufLen);
    if(!keyBuf) {
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }

    _libssh2_store_str(&bufPos, methodName, sizeof(methodName) - 1);
    _libssh2_store_u32(&bufPos, (uint32_t) rawKeyLen);

    if(EVP_PKEY_get_raw_public_key(pk, bufPos, &rawKeyLen) != 1) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "EVP_PKEY_get_raw_public_key failed");
        goto fail;
    }

    *method = methodBuf;
    if(method_len) {
        *method_len = sizeof(methodName) - 1;
    }
    *pubkeydata = keyBuf;
    if(pubkeydata_len) {
        *pubkeydata_len = bufLen;
    }
    return 0;

fail:
    if(methodBuf)
        LIBSSH2_FREE(session, methodBuf);
    if(keyBuf)
        LIBSSH2_FREE(session, keyBuf);
    return -1;
}